

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QIntC.hh
# Opt level: O2

void QIntC::range_check_subtract_error<int>(int *cur,int *delta)

{
  uint uVar1;
  ostream *poVar2;
  range_error *prVar3;
  locale alStack_1c8 [8];
  locale local_1c0 [8];
  string local_1b8 [32];
  ostringstream msg;
  
  uVar1 = *delta;
  if ((int)uVar1 < 1) {
    if (((int)uVar1 < 0) && ((int)(uVar1 + 0x7fffffff) < *cur)) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&msg);
      std::locale::classic();
      std::ios::imbue(alStack_1c8);
      std::locale::~locale(alStack_1c8);
      poVar2 = std::operator<<((ostream *)&msg,"subtracting ");
      poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,*delta);
      poVar2 = std::operator<<(poVar2," from ");
      poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,*cur);
      std::operator<<(poVar2," would cause an integer overflow");
      prVar3 = (range_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::stringbuf::str();
      std::range_error::range_error(prVar3,local_1b8);
      __cxa_throw(prVar3,&std::range_error::typeinfo,std::range_error::~range_error);
    }
  }
  else if (*cur < (int)(uVar1 | 0x80000000)) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&msg);
    std::locale::classic();
    std::ios::imbue(local_1c0);
    std::locale::~locale(local_1c0);
    poVar2 = std::operator<<((ostream *)&msg,"subtracting ");
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,*delta);
    poVar2 = std::operator<<(poVar2," from ");
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,*cur);
    std::operator<<(poVar2," would cause an integer underflow");
    prVar3 = (range_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::range_error::range_error(prVar3,local_1b8);
    __cxa_throw(prVar3,&std::range_error::typeinfo,std::range_error::~range_error);
  }
  return;
}

Assistant:

void
    range_check_subtract_error(T const& cur, T const& delta)
    {
        if ((delta > 0) && ((std::numeric_limits<T>::min() + delta) > cur)) {
            std::ostringstream msg;
            msg.imbue(std::locale::classic());
            msg << "subtracting " << delta << " from " << cur
                << " would cause an integer underflow";
            throw std::range_error(msg.str());
        } else if ((delta < 0) && ((std::numeric_limits<T>::max() + delta) < cur)) {
            std::ostringstream msg;
            msg.imbue(std::locale::classic());
            msg << "subtracting " << delta << " from " << cur << " would cause an integer overflow";
            throw std::range_error(msg.str());
        }
    }